

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesCordSemantics_Test::
TestBody(CppMetadataTest_AnnotatesCordSemantics_Test *this)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  pointer ppGVar4;
  bool bVar5;
  undefined8 uVar6;
  pointer ppGVar7;
  int iVar8;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar9;
  pointer ppGVar10;
  GeneratedCodeInfo *in_R8;
  undefined1 annotation [8];
  string *in_R9;
  size_type __rlen;
  pointer *__ptr;
  initializer_list<int> __l;
  string_view data;
  string_view file_content;
  string_view file_content_00;
  string_view filename;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  AssertionResult gtest_ar__1;
  vector<int,_std::allocator<int>_> field_path;
  string pb_h;
  GeneratedCodeInfo info;
  FileDescriptorProto file;
  GeneratedCodeInfo *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [8];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  local_1c8;
  AssertHelper local_1b0;
  undefined1 local_1a8 [16];
  bool local_198;
  undefined1 local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  pointer local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  GeneratedCodeInfo local_158;
  undefined1 local_128 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_128,(Arena *)0x0);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10),(Arena *)0x0);
  local_178._0_8_ = local_168;
  local_178._8_8_ = (annotation_test_util *)0x0;
  local_168[0] = 0;
  data._M_str = 
  "\n    syntax = \"proto2\";\n    package foo;\n    message Message {\n      optional string sfield = 1 [ctype = CORD];\n      repeated string rsfield = 2 [ctype = CORD];\n    }\n"
  ;
  data._M_len = 0xa8;
  filename._M_str = "test.proto";
  filename._M_len = 10;
  annotation_test_util::AddFile(filename,data);
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  local_190[0] = (internal)
                 CppMetadataTest::CaptureMetadata
                           ((CppMetadataTest *)local_1f8,(string *)local_128,
                            (FileDescriptorProto *)local_178,(string *)(local_168 + 0x10),in_R8,
                            in_R9,in_stack_fffffffffffffdf8,
                            (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))
  ;
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_190,
               (AssertionResult *)
               "CaptureMetadata(\"test.proto\", &file, &pb_h, &info, nullptr, nullptr, nullptr)",
               "false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x13d,(char *)local_1f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if (local_1c8.
        super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  pVVar9 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_128 + 0x30),0);
  annotation = (undefined1  [8])
               ((ulong)(pVVar9->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)local_1f8,"\"Message\"","file.message_type(0).name()",
             (char (*) [8])0x11a6e10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)annotation);
  if (local_1f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_190);
    if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )auStack_1f0 ==
        (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )0x0) {
      annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
    }
    else {
      annotation = *(undefined1 (*) [8])auStack_1f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x13e,(char *)annotation);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((long *)CONCAT71(local_190._1_7_,local_190[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_190._1_7_,local_190[0]) + 8))();
    }
  }
  if (auStack_1f0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1f0);
  }
  local_1f8 = (undefined1  [8])&DAT_00000004;
  auStack_1f0 = (undefined1  [8])0x2;
  __l._M_len = 4;
  __l._M_array = (iterator)local_1f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_190,__l,(allocator_type *)&local_1c8);
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)(local_168 + 0x10),(string *)local_1f8,
             (vector<int,_std::allocator<int>_> *)local_190,&local_1c8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  local_1a8[0] = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1a8[0]) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1a8,(AssertionResult *)"!annotations.empty()",
               "false","true",(char *)in_R9);
    annotation = local_1f8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x143,(char *)local_1f8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
  }
  ppGVar10 = local_1c8.
             super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppGVar4 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1a8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1a8._8_8_);
    ppGVar10 = local_1c8.
               super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppGVar4 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppGVar10 != ppGVar4; ppGVar10 = (pointer)((long *)ppGVar10 + 1)) {
    pcVar1 = (char *)*ppGVar10;
    file_content._M_str = pcVar1;
    file_content._M_len = local_178._0_8_;
    annotation_test_util::GetAnnotationSubstring
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_1a8,
               (annotation_test_util *)local_178._8_8_,file_content,(Annotation *)annotation);
    bVar5 = local_198;
    uVar6 = local_1a8._8_8_;
    local_1d8[0] = local_198;
    local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_198 == false) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1f8,(internal *)local_1d8,
                 (AssertionResult *)"substring.has_value()","false","true",(char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x146,(char *)local_1f8);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&stack0xfffffffffffffe00);
      goto LAB_00a47537;
    }
    sVar2 = CONCAT71(local_1a8._1_7_,local_1a8[0]);
    switch(sVar2) {
    case 6:
      iVar8 = bcmp((void *)local_1a8._8_8_,"sfield",sVar2);
      if (iVar8 == 0) {
        local_1d8._0_4_ = (uint32_t  [1])0x0;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
          if (auStack_1f0 != (undefined1  [8])0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x149,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
          goto LAB_00a46fe3;
        }
        goto LAB_00a46ffb;
      }
      if (sVar2 == 0xe) goto switchD_00a46dc0_caseD_e;
      if (sVar2 == 0xc) goto switchD_00a46dc0_caseD_c;
      if (sVar2 == 10) goto switchD_00a46dc0_caseD_a;
      break;
    case 10:
switchD_00a46dc0_caseD_a:
      iVar8 = bcmp((void *)uVar6,"set_sfield",sVar2);
      if (iVar8 == 0) goto LAB_00a46ee1;
      if (sVar2 == 0xe) goto switchD_00a46dc0_caseD_e;
      if (sVar2 == 0xc) goto switchD_00a46dc0_caseD_c;
      break;
    case 0xc:
switchD_00a46dc0_caseD_c:
      iVar8 = bcmp((void *)uVar6,"clear_sfield",sVar2);
      if (iVar8 == 0) {
LAB_00a46ee1:
        local_1d8._0_4_ = (uint32_t  [1])0x1;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_SET",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
          if ((_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)auStack_1f0 !=
              (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x14c,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
          goto LAB_00a46fe3;
        }
        goto LAB_00a46ffb;
      }
      if (sVar2 == 0xe) goto switchD_00a46dc0_caseD_e;
      break;
    case 0xe:
switchD_00a46dc0_caseD_e:
      iVar8 = bcmp((void *)uVar6,"mutable_sfield",sVar2);
      if (iVar8 == 0) {
        local_1d8._0_4_ = (uint32_t  [1])0x2;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] != (string)0x0) goto LAB_00a46ffb;
        testing::Message::Message((Message *)local_1d8);
        annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
        if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )auStack_1f0 != (GTestFlagSaver *)0x0) {
          annotation = *(undefined1 (*) [8])auStack_1f0;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x14f,(char *)annotation);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
LAB_00a46fe3:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
        if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
        }
LAB_00a46ffb:
        if (auStack_1f0 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1f0);
        }
      }
    }
    if (bVar5 == false) goto LAB_00a4757c;
  }
  *(undefined4 *)((long)&local_188[-1].field_2 + 0xc) = 1;
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_1c8.
    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1c8.
         super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)(local_168 + 0x10),(string *)local_1f8,
             (vector<int,_std::allocator<int>_> *)local_190,&local_1c8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  local_1a8[0] = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1a8[0]) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1a8,(AssertionResult *)"!annotations.empty()",
               "false","true",(char *)in_R9);
    annotation = local_1f8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x155,(char *)local_1f8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
  }
  ppGVar4 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppGVar10 = local_1c8.
             super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppGVar7 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1a8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1a8._8_8_);
    ppGVar4 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppGVar10 = local_1c8.
               super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppGVar7 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  while( true ) {
    local_1c8.
    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppGVar7;
    ppGVar7 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = ppGVar4 ==
            local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.
    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppGVar10;
    if (bVar5) goto LAB_00a4757c;
    pcVar1 = (char *)*ppGVar4;
    file_content_00._M_str = pcVar1;
    file_content_00._M_len = local_178._0_8_;
    annotation_test_util::GetAnnotationSubstring
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_1a8,
               (annotation_test_util *)local_178._8_8_,file_content_00,(Annotation *)annotation);
    bVar5 = local_198;
    uVar6 = local_1a8._8_8_;
    local_1d8[0] = local_198;
    local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_198 == false) break;
    sVar2 = CONCAT71(local_1a8._1_7_,local_1a8[0]);
    switch(sVar2) {
    case 7:
      iVar8 = bcmp((void *)local_1a8._8_8_,"rsfield",sVar2);
      if (iVar8 == 0) {
        local_1d8._0_4_ = (uint32_t  [1])0x0;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
          if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )auStack_1f0 !=
              (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x15b,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
          goto LAB_00a47427;
        }
        goto LAB_00a4743f;
      }
      if (sVar2 == 0xf) goto switchD_00a471d0_caseD_f;
      if (sVar2 == 0xd) goto switchD_00a471d0_caseD_d;
      if (sVar2 == 0xb) goto switchD_00a471d0_caseD_b;
      break;
    case 0xb:
switchD_00a471d0_caseD_b:
      iVar8 = bcmp((void *)uVar6,"set_rsfield",sVar2);
      if (iVar8 == 0) goto LAB_00a47325;
      if (sVar2 == 0xb) {
LAB_00a47260:
        iVar8 = bcmp((void *)uVar6,"add_rsfield",sVar2);
        if (iVar8 == 0) goto LAB_00a47325;
        if (sVar2 == 0xf) goto switchD_00a471d0_caseD_f;
      }
      else {
        if (sVar2 == 0xf) goto switchD_00a471d0_caseD_f;
        if (sVar2 == 0xd) goto switchD_00a471d0_caseD_d;
      }
      break;
    case 0xd:
switchD_00a471d0_caseD_d:
      iVar8 = bcmp((void *)uVar6,"clear_rsfield",sVar2);
      if (iVar8 == 0) {
LAB_00a47325:
        local_1d8._0_4_ = (uint32_t  [1])0x1;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_SET",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
          if (auStack_1f0 != (undefined1  [8])0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x15f,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
          goto LAB_00a47427;
        }
        goto LAB_00a4743f;
      }
      if (sVar2 == 0xf) goto switchD_00a471d0_caseD_f;
      if (sVar2 == 0xb) goto LAB_00a47260;
      break;
    case 0xf:
switchD_00a471d0_caseD_f:
      iVar8 = bcmp((void *)uVar6,"mutable_rsfield",sVar2);
      if (iVar8 == 0) {
        local_1d8._0_4_ = (uint32_t  [1])0x2;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] != (string)0x0) goto LAB_00a4743f;
        testing::Message::Message((Message *)local_1d8);
        annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
        if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )auStack_1f0 != (GTestFlagSaver *)0x0) {
          annotation = *(undefined1 (*) [8])auStack_1f0;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x162,(char *)annotation);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
LAB_00a47427:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
        if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
        }
LAB_00a4743f:
        if (auStack_1f0 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1f0);
        }
      }
    }
    ppGVar4 = (pointer)((long *)ppGVar4 + 1);
    ppGVar10 = local_1c8.
               super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar5 == false) goto LAB_00a4757c;
  }
  testing::Message::Message((Message *)&stack0xfffffffffffffe00);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_1f8,(internal *)local_1d8,(AssertionResult *)"substring.has_value()",
             "false","true",(char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_1b0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
             ,0x158,(char *)local_1f8);
  testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&stack0xfffffffffffffe00);
LAB_00a47537:
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  if ((long *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1d8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._8_8_);
  }
LAB_00a4757c:
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_190._1_7_,local_190[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_180 - (long)pvVar3);
  }
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,CONCAT71(local_168._1_7_,local_168[0]) + 1);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesCordSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kCordFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_sfield" || *substring == "clear_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
  field_path.back() = 1;
  annotations.clear();
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_rsfield" || *substring == "clear_rsfield" ||
               *substring == "add_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}